

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_avx2.cpp
# Opt level: O2

void intermediate_adder_avx2
               (uint *b,uint *end,IntermediateBuffer *intermediate,int offset,int *fx,int fdx)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  
  uVar5 = *fx + offset * -0x10000;
  *fx = uVar5;
  auVar4 = _DAT_0060da80;
  iVar8 = fdx * 4;
  iVar6 = uVar5 + fdx + fdx;
  auVar1 = vpinsrd_avx(ZEXT416(uVar5),uVar5 + fdx,1);
  auVar1 = vpinsrd_avx(auVar1,iVar6,2);
  auVar1 = vpinsrd_avx(auVar1,iVar6 + fdx,3);
  auVar10._4_4_ = iVar8;
  auVar10._0_4_ = iVar8;
  auVar10._8_4_ = iVar8;
  auVar10._12_4_ = iVar8;
  auVar11._8_2_ = 0x100;
  auVar11._0_8_ = 0x100010001000100;
  auVar11._10_2_ = 0x100;
  auVar11._12_2_ = 0x100;
  auVar11._14_2_ = 0x100;
  auVar12._8_2_ = 0xff;
  auVar12._0_8_ = 0xff00ff00ff00ff;
  auVar12._10_2_ = 0xff;
  auVar12._12_2_ = 0xff;
  auVar12._14_2_ = 0xff;
  while (b < (undefined1 (*) [16])(end + -3)) {
    vpsrld_avx(auVar1,0x10);
    auVar13 = vpcmpeqd_avx2(in_ZMM6._0_32_,in_ZMM6._0_32_);
    auVar15 = vpgatherdq(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar13);
    auVar13 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar16 = vpgatherdq(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar13);
    auVar14 = vpshufb_avx(auVar1,auVar4);
    auVar2 = vpsubw_avx(auVar11,auVar14);
    auVar3 = vpunpckldq_avx(auVar2,auVar14);
    auVar14 = vpunpckhdq_avx(auVar2,auVar14);
    auVar13._0_16_ = ZEXT116(0) * auVar14 + ZEXT116(1) * auVar3;
    auVar13._16_16_ = ZEXT116(1) * auVar14;
    auVar15 = vpmullw_avx2(auVar15,auVar13);
    auVar13 = vpmullw_avx2(auVar16,auVar13);
    auVar13 = vphaddd_avx2(auVar15,auVar13);
    auVar13 = vpermq_avx2(auVar13,0xd8);
    auVar14 = vpsrlw_avx(auVar13._0_16_,8);
    in_ZMM6 = ZEXT3264(CONCAT1616(auVar15._16_16_,auVar14));
    auVar14 = vpblendvb_avx(auVar13._16_16_,auVar14,auVar12);
    *(undefined1 (*) [16])b = auVar14;
    b = (uint *)((long)b + 0x10);
    auVar1 = vpaddd_avx(auVar1,auVar10);
  }
  uVar5 = auVar1._0_4_;
  for (; *fx = uVar5, b < end; b = (uint *)(*(undefined1 (*) [16])b + 4)) {
    uVar7 = uVar5 >> 8 & 0xff;
    lVar9 = (long)((int)uVar5 >> 0x10);
    *(quint32 *)*(undefined1 (*) [16])b =
         intermediate->buffer_rb[lVar9 + 1] * uVar7 +
         intermediate->buffer_rb[lVar9] * (0x100 - uVar7) >> 8 & 0xff00ff |
         uVar7 * intermediate->buffer_ag[lVar9 + 1] +
         (0x100 - uVar7) * intermediate->buffer_ag[lVar9] & 0xff00ff00;
    uVar5 = *fx + fdx;
  }
  *fx = uVar5 + offset * 0x10000;
  return;
}

Assistant:

void QT_FASTCALL intermediate_adder_avx2(uint *b, uint *end, const IntermediateBuffer &intermediate, int offset, int &fx, int fdx)
{
    fx -= offset * FixedScale;

    const __m128i v_fdx = _mm_set1_epi32(fdx * 4);
    const __m128i v_blend = _mm_set1_epi32(0x00800080);
    const __m128i vdx_shuffle = _mm_set_epi8(char(0x80), 13, char(0x80), 13, char(0x80), 9, char(0x80), 9,
                                             char(0x80),  5, char(0x80),  5, char(0x80), 1, char(0x80), 1);
    __m128i v_fx = _mm_setr_epi32(fx, fx + fdx, fx + fdx + fdx, fx + fdx + fdx + fdx);

    while (b < end - 3) {
        const __m128i offset = _mm_srli_epi32(v_fx, 16);
        __m256i vrb = _mm256_i32gather_epi64((const long long *)intermediate.buffer_rb, offset, 4);
        __m256i vag = _mm256_i32gather_epi64((const long long *)intermediate.buffer_ag, offset, 4);

        __m128i vdx = _mm_shuffle_epi8(v_fx, vdx_shuffle);
        __m128i vidx = _mm_sub_epi16(_mm_set1_epi16(256), vdx);
        __m256i vmulx = _mm256_castsi128_si256(_mm_unpacklo_epi32(vidx, vdx));
        vmulx = _mm256_inserti128_si256(vmulx, _mm_unpackhi_epi32(vidx, vdx), 1);

        vrb = _mm256_mullo_epi16(vrb, vmulx);
        vag = _mm256_mullo_epi16(vag, vmulx);

        __m256i vrbag = _mm256_hadd_epi32(vrb, vag);
        vrbag = _mm256_permute4x64_epi64(vrbag, _MM_SHUFFLE(3, 1, 2, 0));

        __m128i rb = _mm256_castsi256_si128(vrbag);
        __m128i ag = _mm256_extracti128_si256(vrbag, 1);
        rb = _mm_srli_epi16(rb, 8);

        _mm_storeu_si128((__m128i*)b, _mm_blendv_epi8(ag, rb, v_blend));

        b += 4;
        v_fx = _mm_add_epi32(v_fx, v_fdx);
    }
    fx = _mm_cvtsi128_si32(v_fx);
    while (b < end) {
        const int x = (fx >> 16);

        const uint distx = (fx & 0x0000ffff) >> 8;
        const uint idistx = 256 - distx;
        const uint rb = (intermediate.buffer_rb[x] * idistx + intermediate.buffer_rb[x + 1] * distx) & 0xff00ff00;
        const uint ag = (intermediate.buffer_ag[x] * idistx + intermediate.buffer_ag[x + 1] * distx) & 0xff00ff00;
        *b = (rb >> 8) | ag;
        b++;
        fx += fdx;
    }
    fx += offset * FixedScale;
}